

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::Preprocessor
          (Preprocessor *this,SourceManager *sourceManager,BumpAllocator *alloc,
          Diagnostics *diagnostics,Bag *options_,
          span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
          inheritedMacros)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint64_t hash;
  ulong pos0;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  il;
  try_emplace_args_t local_4d1;
  Preprocessor *local_4d0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_4c8;
  flat_hash_map<std::string_view,_void_(slang::parsing::Preprocessor::*)(Token,_const_syntax::PragmaExpressionSyntax_*,_SmallVectorBase<Token>_&)>
  *local_4c0;
  vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_> *local_4b8
  ;
  string_view name;
  DefineDirectiveSyntax *define;
  NumberParser *local_498;
  flat_hash_set<const_char_*> *local_490;
  LexerOptions *local_488;
  PreprocessorOptions *local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  pointer local_460;
  uchar local_458;
  uchar uStack_457;
  uchar uStack_456;
  byte bStack_455;
  uchar uStack_454;
  uchar uStack_453;
  uchar uStack_452;
  byte bStack_451;
  uchar uStack_450;
  uchar uStack_44f;
  uchar uStack_44e;
  byte bStack_44d;
  uchar uStack_44c;
  uchar uStack_44b;
  uchar uStack_44a;
  byte bStack_449;
  uchar local_448;
  uchar uStack_447;
  uchar uStack_446;
  byte bStack_445;
  uchar uStack_444;
  uchar uStack_443;
  uchar uStack_442;
  byte bStack_441;
  uchar uStack_440;
  uchar uStack_43f;
  uchar uStack_43e;
  byte bStack_43d;
  uchar uStack_43c;
  uchar uStack_43b;
  uchar uStack_43a;
  byte bStack_439;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  local_430 [32];
  
  this->sourceManager = sourceManager;
  this->alloc = alloc;
  this->diagnostics = diagnostics;
  local_480 = &this->options;
  Bag::getOrDefault<slang::parsing::PreprocessorOptions>(local_480,options_);
  local_488 = &this->lexerOptions;
  Bag::getOrDefault<slang::parsing::LexerOptions>(local_488,options_);
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .data_ = (pointer)(this->lexerStack).
                    super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                    .firstElement;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .len = 0;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .cap = 2;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.data_ =
       (pointer)(this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>
                .firstElement;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len = 0;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.cap = 2;
  local_4c8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&this->macros;
  local_4d0 = this;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              *)local_4c8);
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  this->currentMacroToken = (Token *)0x0;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastConsumed);
  this->inMacroBody = false;
  this->inIfDefCondition = false;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.firstElement
  ;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  local_490 = &this->includeOnceHeaders;
  boost::unordered::
  unordered_flat_set<const_char_*,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  ::unordered_flat_set(local_490);
  local_4b8 = &this->keywordVersionStack;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  this->protectLineLength = 0;
  this->protectBytes = 0;
  this->designElementDepth = 0;
  this->includeDepth = 0;
  this->protectEncryptDepth = 0;
  this->protectDecryptDepth = 0;
  this->protectEncoding = Raw;
  local_498 = &this->numberParser;
  NumberParser::NumberParser(local_498,diagnostics,alloc,(this->options).languageVersion);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  ::unordered_flat_map(&this->pragmaProtectHandlers);
  local_4c0 = &this->pragmaProtectHandlers;
  local_430[0].first._M_len._0_1_ =
       LexerFacts::getDefaultKeywordVersion((this->options).languageVersion);
  std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
  emplace_back<slang::parsing::KeywordVersion>(local_4b8,(KeywordVersion *)local_430);
  resetAllDirectives(this);
  undefineAll(this);
  local_460 = inheritedMacros._M_ptr + inheritedMacros._M_extent._M_extent_value;
  do {
    if (inheritedMacros._M_ptr == local_460) {
      memcpy(local_430,&DAT_0057a878,0x400);
      il._M_len = 0x20;
      il._M_array = local_430;
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
      ::operator=(local_4c0,il);
      return;
    }
    define = *inheritedMacros._M_ptr;
    name = Token::valueText(&define->name);
    phVar6 = local_4c8;
    if (name._M_len != 0) {
      hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       (local_4c8,&name);
      pos0 = hash >> ((byte)*phVar6 & 0x3f);
      lVar11 = (hash & 0xff) * 4;
      uVar15 = (&UNK_003fea9c)[lVar11];
      uVar16 = (&UNK_003fea9d)[lVar11];
      uVar17 = (&UNK_003fea9e)[lVar11];
      bVar18 = (&UNK_003fea9f)[lVar11];
      uVar13 = (ulong)((uint)hash & 7);
      uVar10 = 0;
      uVar12 = pos0;
      uVar19 = uVar15;
      uVar20 = uVar16;
      uVar21 = uVar17;
      bVar22 = bVar18;
      uVar23 = uVar15;
      uVar24 = uVar16;
      uVar25 = uVar17;
      bVar26 = bVar18;
      uVar27 = uVar15;
      uVar28 = uVar16;
      uVar29 = uVar17;
      bVar30 = bVar18;
      do {
        pgVar2 = (this->macros).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 .arrays.groups_;
        pgVar1 = pgVar2 + uVar12;
        local_448 = pgVar1->m[0].n;
        uStack_447 = pgVar1->m[1].n;
        uStack_446 = pgVar1->m[2].n;
        bStack_445 = pgVar1->m[3].n;
        uStack_444 = pgVar1->m[4].n;
        uStack_443 = pgVar1->m[5].n;
        uStack_442 = pgVar1->m[6].n;
        bStack_441 = pgVar1->m[7].n;
        uStack_440 = pgVar1->m[8].n;
        uStack_43f = pgVar1->m[9].n;
        uStack_43e = pgVar1->m[10].n;
        bStack_43d = pgVar1->m[0xb].n;
        uStack_43c = pgVar1->m[0xc].n;
        uStack_43b = pgVar1->m[0xd].n;
        uStack_43a = pgVar1->m[0xe].n;
        bVar8 = pgVar1->m[0xf].n;
        auVar14[0] = -(local_448 == uVar15);
        auVar14[1] = -(uStack_447 == uVar16);
        auVar14[2] = -(uStack_446 == uVar17);
        auVar14[3] = -(bStack_445 == bVar18);
        auVar14[4] = -(uStack_444 == uVar19);
        auVar14[5] = -(uStack_443 == uVar20);
        auVar14[6] = -(uStack_442 == uVar21);
        auVar14[7] = -(bStack_441 == bVar22);
        auVar14[8] = -(uStack_440 == uVar23);
        auVar14[9] = -(uStack_43f == uVar24);
        auVar14[10] = -(uStack_43e == uVar25);
        auVar14[0xb] = -(bStack_43d == bVar26);
        auVar14[0xc] = -(uStack_43c == uVar27);
        auVar14[0xd] = -(uStack_43b == uVar28);
        auVar14[0xe] = -(uStack_43a == uVar29);
        auVar14[0xf] = -(bVar8 == bVar30);
        uVar9 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
        bStack_439 = bVar8;
        if (uVar9 != 0) {
          ppVar3 = (this->macros).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   .arrays.elements_;
          local_478 = uVar13;
          local_470 = uVar12;
          local_468 = uVar10;
          local_458 = uVar15;
          uStack_457 = uVar16;
          uStack_456 = uVar17;
          bStack_455 = bVar18;
          uStack_454 = uVar19;
          uStack_453 = uVar20;
          uStack_452 = uVar21;
          bStack_451 = bVar22;
          uStack_450 = uVar23;
          uStack_44f = uVar24;
          uStack_44e = uVar25;
          bStack_44d = bVar26;
          uStack_44c = uVar27;
          uStack_44b = uVar28;
          uStack_44a = uVar29;
          bStack_449 = bVar30;
          do {
            iVar5 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
              }
            }
            bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               local_4c8,&name,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               ((long)&ppVar3[uVar12 * 0xf].first._M_len + (ulong)(uint)(iVar5 << 5)
                               ));
            this = local_4d0;
            if (bVar7) goto LAB_0017c4d7;
            uVar9 = uVar9 - 1 & uVar9;
          } while (uVar9 != 0);
          bVar8 = pgVar2[uVar12].m[0xf].n;
          uVar10 = local_468;
          uVar12 = local_470;
          uVar13 = local_478;
          uVar15 = local_458;
          uVar16 = uStack_457;
          uVar17 = uStack_456;
          bVar18 = bStack_455;
          uVar19 = uStack_454;
          uVar20 = uStack_453;
          uVar21 = uStack_452;
          bVar22 = bStack_451;
          uVar23 = uStack_450;
          uVar24 = uStack_44f;
          uVar25 = uStack_44e;
          bVar26 = bStack_44d;
          uVar27 = uStack_44c;
          uVar28 = uStack_44b;
          uVar29 = uStack_44a;
          bVar30 = bStack_449;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar13] & bVar8) == 0) break;
        uVar4 = (local_4d0->macros).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                .arrays.groups_size_mask;
        lVar11 = uVar12 + uVar10;
        uVar10 = uVar10 + 1;
        uVar12 = lVar11 + 1U & uVar4;
        this = local_4d0;
      } while (uVar10 <= uVar4);
      if ((local_4d0->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.size <
          (local_4d0->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
                  ((locator *)local_430,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)local_4c8,pos0,hash,&local_4d1,&name,&define);
        this = local_4d0;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
                  ((locator *)local_430,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)local_4c8,hash,&local_4d1,&name,&define);
        this = local_4d0;
      }
    }
LAB_0017c4d7:
    inheritedMacros._M_ptr = inheritedMacros._M_ptr + 1;
  } while( true );
}

Assistant:

Preprocessor::Preprocessor(SourceManager& sourceManager, BumpAllocator& alloc,
                           Diagnostics& diagnostics, const Bag& options_,
                           std::span<const DefineDirectiveSyntax* const> inheritedMacros) :
    sourceManager(sourceManager), alloc(alloc), diagnostics(diagnostics),
    options(options_.getOrDefault<PreprocessorOptions>()),
    lexerOptions(options_.getOrDefault<LexerOptions>()),
    numberParser(diagnostics, alloc, options.languageVersion) {

    keywordVersionStack.push_back(LF::getDefaultKeywordVersion(options.languageVersion));
    resetAllDirectives();
    undefineAll();

    // Add in any inherited macros that aren't already set in our map.
    for (auto define : inheritedMacros) {
        auto name = define->name.valueText();
        if (!name.empty())
            macros.emplace(name, define);
    }

    // clang-format off
    pragmaProtectHandlers = {
        { "begin", &Preprocessor::handleProtectBegin },
        { "end", &Preprocessor::handleProtectEnd },
        { "begin_protected", &Preprocessor::handleProtectBeginProtected },
        { "end_protected", &Preprocessor::handleProtectEndProtected },
        { "author", &Preprocessor::handleProtectSingleArgIgnore },
        { "author_info", &Preprocessor::handleProtectSingleArgIgnore },
        { "encrypt_agent", &Preprocessor::handleProtectSingleArgIgnore },
        { "encrypt_agent_info", &Preprocessor::handleProtectSingleArgIgnore },
        { "encoding", &Preprocessor::handleProtectEncoding },
        { "data_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_public_key", &Preprocessor::handleProtectKey },
        { "data_decrypt_key", &Preprocessor::handleProtectKey },
        { "data_block", &Preprocessor::handleProtectBlock },
        { "digest_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_key_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_public_key", &Preprocessor::handleProtectKey },
        { "digest_decrypt_key", &Preprocessor::handleProtectKey },
        { "digest_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_block", &Preprocessor::handleProtectBlock },
        { "key_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_public_key", &Preprocessor::handleProtectKey },
        { "key_block", &Preprocessor::handleProtectBlock },
        { "decrypt_license", &Preprocessor::handleProtectLicense },
        { "runtime_license", &Preprocessor::handleProtectLicense },
        { "comment", &Preprocessor::handleProtectSingleArgIgnore },
        { "reset", &Preprocessor::handleProtectReset },
        { "viewport", &Preprocessor::handleProtectViewport }
    };
    // clang-format on
}